

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O0

ssize_t __thiscall xmrig::Config::read(Config *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint32_t uVar2;
  ConfigPrivate *pCVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  long *plVar4;
  bool bVar5;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  pCVar3 = (ConfigPrivate *)BaseConfig::read(&this->super_BaseConfig,__fd,__buf,__nbytes);
  bVar5 = ((ulong)pCVar3 & 1) != 0;
  if (bVar5) {
    pCVar3 = this->d_ptr;
    iVar1 = (**(code **)(*plVar4 + 0x38))(plVar4,kCPU);
    CpuConfig::read(&pCVar3->cpu,iVar1,__buf_00,__nbytes);
    pCVar3 = this->d_ptr;
    iVar1 = (**(code **)(*plVar4 + 0x38))(plVar4,kOcl);
    OclConfig::read(&pCVar3->cl,iVar1,__buf_01,__nbytes);
    pCVar3 = this->d_ptr;
    iVar1 = (**(code **)(*plVar4 + 0x38))(plVar4,kCuda);
    CudaConfig::read(&pCVar3->cuda,iVar1,__buf_02,__nbytes);
    uVar2 = (**(code **)(*plVar4 + 0x58))(plVar4,kHealthPrintTime,this->d_ptr->healthPrintTime);
    pCVar3 = this->d_ptr;
    pCVar3->healthPrintTime = uVar2;
  }
  return CONCAT71((int7)((ulong)pCVar3 >> 8),bVar5);
}

Assistant:

bool xmrig::Config::read(const IJsonReader &reader, const char *fileName)
{
    if (!BaseConfig::read(reader, fileName)) {
        return false;
    }

    d_ptr->cpu.read(reader.getValue(kCPU));

#   ifdef XMRIG_FEATURE_OPENCL
    d_ptr->cl.read(reader.getValue(kOcl));
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    d_ptr->cuda.read(reader.getValue(kCuda));
#   endif

#   ifdef XMRIG_FEATURE_NVML
    d_ptr->healthPrintTime = reader.getUint(kHealthPrintTime, d_ptr->healthPrintTime);
#   endif

    return true;
}